

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O1

void __thiscall
google::protobuf::anon_unknown_19::FieldValuePrinterWrapper::PrintDouble
          (FieldValuePrinterWrapper *this,double val,BaseTextGenerator *generator)

{
  undefined1 *local_30;
  undefined8 local_28;
  undefined1 local_20 [16];
  
  (*((this->delegate_)._M_t.
     super___uniq_ptr_impl<const_google::protobuf::TextFormat::FieldValuePrinter,_std::default_delete<const_google::protobuf::TextFormat::FieldValuePrinter>_>
     ._M_t.
     super__Tuple_impl<0UL,_const_google::protobuf::TextFormat::FieldValuePrinter_*,_std::default_delete<const_google::protobuf::TextFormat::FieldValuePrinter>_>
     .super__Head_base<0UL,_const_google::protobuf::TextFormat::FieldValuePrinter_*,_false>.
    _M_head_impl)->_vptr_FieldValuePrinter[8])(&local_30);
  (*generator->_vptr_BaseTextGenerator[5])(generator,local_30,local_28);
  if (local_30 != local_20) {
    operator_delete(local_30);
  }
  return;
}

Assistant:

void PrintDouble(double val,
                   TextFormat::BaseTextGenerator* generator) const override {
    generator->PrintString(delegate_->PrintDouble(val));
  }